

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLine.cpp
# Opt level: O2

bool __thiscall
chrono::geometry::ChLine::DrawPostscript
          (ChLine *this,ChFile_ps *mfle,int markpoints,int bezier_interpolate)

{
  int iVar1;
  int i;
  int iVar2;
  ChVector2<double> local_c8;
  ChVector2<double> local_b8;
  double local_a8;
  double dStack_a0;
  ChVector<double> mv1;
  ChVector2<double> local_78;
  ChVector2<double> local_68;
  ChVector2<double> local_58;
  ChVector2<double> local_48;
  
  mv1.m_data[2] = 0.0;
  mv1.m_data[0] = 0.0;
  mv1.m_data[1] = 0.0;
  ChFile_ps::GrSave(mfle);
  local_48.m_data[0] = (mfle->G_p).m_data[0];
  local_48.m_data[1] = (mfle->G_p).m_data[1];
  local_58.m_data[0] = (mfle->Gs_p).m_data[0];
  local_58.m_data[1] = (mfle->Gs_p).m_data[1];
  ChFile_ps::ClipRectangle(mfle,&local_48,&local_58,PAGE);
  ChFile_ps::StartLine(mfle);
  (*(this->super_ChGeometry)._vptr_ChGeometry[0xb])(0,this,&mv1);
  local_68.m_data[0] = mv1.m_data[0];
  local_68.m_data[1] = mv1.m_data[1];
  ChFile_ps::To_page_from_graph(mfle,&local_68);
  local_78.m_data[0] = local_a8;
  local_78.m_data[1] = dStack_a0;
  ChFile_ps::MoveTo(mfle,&local_78);
  iVar1 = (*(this->super_ChGeometry)._vptr_ChGeometry[0xf])(this);
  iVar2 = 1;
  while( true ) {
    if ((double)(iVar1 * 10) < (double)iVar2) break;
    (*(this->super_ChGeometry)._vptr_ChGeometry[0xb])
              ((double)iVar2 / (double)(iVar1 * 10),this,&mv1);
    local_b8.m_data[0] = mv1.m_data[0];
    local_b8.m_data[1] = mv1.m_data[1];
    ChFile_ps::To_page_from_graph(mfle,&local_b8);
    local_c8.m_data[0] = local_a8;
    local_c8.m_data[1] = dStack_a0;
    ChFile_ps::AddLinePoint(mfle,&local_c8);
    iVar2 = iVar2 + 1;
  }
  iVar2 = (*(this->super_ChGeometry)._vptr_ChGeometry[0xd])(this);
  if ((char)iVar2 != '\0') {
    ChFile_ps::CloseLine(mfle);
  }
  ChFile_ps::PaintStroke(mfle);
  ChFile_ps::GrRestore(mfle);
  return true;
}

Assistant:

bool ChLine::DrawPostscript(ChFile_ps* mfle, int markpoints, int bezier_interpolate) {
    ChVector2<> mp1;
    ChVector<> mv1;

    mfle->GrSave();
    mfle->ClipRectangle(mfle->Get_G_p(), mfle->Get_Gs_p(), ChFile_ps::Space::PAGE);
    // start a line, move cursor to beginning
    mfle->StartLine();
    this->Evaluate(mv1, 0.0);
    mp1.x() = mv1.x();
    mp1.y() = mv1.y();
    mp1 = mfle->To_page_from_graph(mp1);
    mfle->MoveTo(mp1);
    double maxpoints = this->Get_complexity() * 10;
    // add points into line
    for (int i = 1; i <= maxpoints; i++) {
        this->Evaluate(mv1, ((double)i) / ((double)maxpoints));
        mp1.x() = mv1.x();
        mp1.y() = mv1.y();
        mp1 = mfle->To_page_from_graph(mp1);
        mfle->AddLinePoint(mp1);
    }
    if (this->Get_closed())
        mfle->CloseLine();  // if periodic curve, close it

    mfle->PaintStroke();  // draw it!
    mfle->GrRestore();    // restore old modes, with old clipping

    return true;
}